

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O1

string * __thiscall
Assimp::BVHLoader::GetNextToken_abi_cxx11_(string *__return_storage_ptr__,BVHLoader *this)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  
  pcVar2 = (this->mBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar5 = (this->mReader)._M_current;
  if (pcVar5 != pcVar2) {
    uVar4 = this->mLine;
    do {
      cVar1 = *pcVar5;
      iVar3 = isspace((int)cVar1);
      if (iVar3 == 0) break;
      if (cVar1 == '\n') {
        uVar4 = uVar4 + 1;
        this->mLine = uVar4;
      }
      pcVar5 = pcVar5 + 1;
      (this->mReader)._M_current = pcVar5;
    } while (pcVar5 != pcVar2);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  do {
    pcVar2 = (this->mReader)._M_current;
    if (pcVar2 == (this->mBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      return __return_storage_ptr__;
    }
    iVar3 = isspace((int)*pcVar2);
    if (iVar3 != 0) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    (this->mReader)._M_current = (this->mReader)._M_current + 1;
    iVar3 = std::__cxx11::string::compare((char *)__return_storage_ptr__);
    if (iVar3 == 0) {
      return __return_storage_ptr__;
    }
    iVar3 = std::__cxx11::string::compare((char *)__return_storage_ptr__);
  } while (iVar3 != 0);
  return __return_storage_ptr__;
}

Assistant:

std::string BVHLoader::GetNextToken()
{
    // skip any preceding whitespace
    while( mReader != mBuffer.end())
    {
        if( !isspace( *mReader))
            break;

        // count lines
        if( *mReader == '\n')
            mLine++;

        ++mReader;
    }

    // collect all chars till the next whitespace. BVH is easy in respect to that.
    std::string token;
    while( mReader != mBuffer.end())
    {
        if( isspace( *mReader))
            break;

        token.push_back( *mReader);
        ++mReader;

        // little extra logic to make sure braces are counted correctly
        if( token == "{" || token == "}")
            break;
    }

    // empty token means end of file, which is just fine
    return token;
}